

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void readannotations(uint32 numannos,uint8 *base,uint8 **ptr,uint32 *len,
                    MOJOSHADER_effectAnnotation **annotations,MOJOSHADER_effectObject *objects,
                    MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  uint32 *puVar2;
  uint32 uVar3;
  MOJOSHADER_effectAnnotation *pMVar4;
  uint32 valoffset;
  long lVar5;
  uint32 typeoffset;
  
  if (numannos != 0) {
    pMVar4 = (MOJOSHADER_effectAnnotation *)(*m)(numannos << 6,d);
    *annotations = pMVar4;
    lVar5 = 0;
    memset(pMVar4,0,(ulong)(numannos << 6));
    do {
      pMVar4 = *annotations;
      uVar1 = *len;
      typeoffset = 0;
      uVar3 = 0;
      valoffset = 0;
      if (3 < uVar1) {
        puVar2 = (uint32 *)*ptr;
        typeoffset = *puVar2;
        *ptr = (uint8 *)(puVar2 + 1);
        *len = uVar1 - 4;
        if (uVar1 - 4 < 4) {
          uVar3 = 0;
          valoffset = 0;
        }
        else {
          valoffset = puVar2[1];
          *ptr = (uint8 *)(puVar2 + 2);
          uVar3 = uVar1 - 8;
        }
      }
      *len = uVar3;
      readvalue(base,typeoffset,valoffset,(MOJOSHADER_effectValue *)((long)&pMVar4->name + lVar5),
                objects,m,d);
      lVar5 = lVar5 + 0x40;
    } while ((ulong)numannos << 6 != lVar5);
  }
  return;
}

Assistant:

static void readannotations(const uint32 numannos,
                            const uint8 *base,
                            const uint8 **ptr,
                            uint32 *len,
                            MOJOSHADER_effectAnnotation **annotations,
                            MOJOSHADER_effectObject *objects,
                            MOJOSHADER_malloc m,
                            void *d)
{
    int i;
    if (numannos == 0) return;

    const uint32 siz = sizeof(MOJOSHADER_effectAnnotation) * numannos;
    *annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
    memset(*annotations, '\0', siz);

    for (i = 0; i < numannos; i++)
    {
        MOJOSHADER_effectAnnotation *anno = &(*annotations)[i];

        const uint32 typeoffset = readui32(ptr, len);
        const uint32 valoffset = readui32(ptr, len);

        readvalue(base, typeoffset, valoffset,
                  anno, objects,
                  m, d);
    } // for
}